

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

target_ulong_conflict helper_bitswap_mips(target_ulong_conflict rt)

{
  uint uVar1;
  
  uVar1 = (rt >> 1 & 0x55555555) + (rt & 0xd5555555) * 2;
  uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0xf3333333) * 4;
  return uVar1 * 0x10 & 0xf0f0f0f0 | uVar1 >> 4 & 0xf0f0f0f;
}

Assistant:

static inline target_ulong bitswap(target_ulong v)
{
    v = ((v >> 1) & (target_ulong)0x5555555555555555ULL) |
              ((v & (target_ulong)0x5555555555555555ULL) << 1);
    v = ((v >> 2) & (target_ulong)0x3333333333333333ULL) |
              ((v & (target_ulong)0x3333333333333333ULL) << 2);
    v = ((v >> 4) & (target_ulong)0x0F0F0F0F0F0F0F0FULL) |
              ((v & (target_ulong)0x0F0F0F0F0F0F0F0FULL) << 4);
    return v;
}